

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::ProcessAddrFetch(CConnman *this)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  ServiceFlags SVar2;
  long in_FS_OFFSET;
  CSemaphoreGrant grant;
  CAddress addr;
  string strDest;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  strDest._M_dataplus._M_p = (pointer)&strDest.field_2;
  strDest._M_string_length = 0;
  strDest.field_2._M_local_buf[0] = '\0';
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&addr,&this->m_addr_fetches_mutex,
             "m_addr_fetches_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0x922,false);
  __str = (this->m_addr_fetches).
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->m_addr_fetches).
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == __str) {
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&addr);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&strDest,__str);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&this->m_addr_fetches);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&addr);
    SVar2 = (this->nLocalServices)._M_i;
    CAddress::CAddress(&addr);
    grant.sem = (this->semOutbound)._M_t.
                super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
                super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
                super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl;
    grant.fHaveGrant = false;
    CSemaphoreGrant::TryAcquire(&grant);
    if (grant.fHaveGrant == true) {
      OpenNetworkConnection
                (this,&addr,false,&grant,strDest._M_dataplus._M_p,ADDR_FETCH,
                 (bool)((byte)(SVar2 >> 0xb) & 1));
    }
    CSemaphoreGrant::Release(&grant);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  }
  std::__cxx11::string::~string((string *)&strDest);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::ProcessAddrFetch()
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    std::string strDest;
    {
        LOCK(m_addr_fetches_mutex);
        if (m_addr_fetches.empty())
            return;
        strDest = m_addr_fetches.front();
        m_addr_fetches.pop_front();
    }
    // Attempt v2 connection if we support v2 - we'll reconnect with v1 if our
    // peer doesn't support it or immediately disconnects us for another reason.
    const bool use_v2transport(GetLocalServices() & NODE_P2P_V2);
    CAddress addr;
    CSemaphoreGrant grant(*semOutbound, /*fTry=*/true);
    if (grant) {
        OpenNetworkConnection(addr, false, std::move(grant), strDest.c_str(), ConnectionType::ADDR_FETCH, use_v2transport);
    }
}